

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

vector<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_> * __thiscall
anurbs::Model::of_type<anurbs::Brep>
          (vector<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>
           *__return_storage_ptr__,Model *this)

{
  bool bVar1;
  ulong index;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<anurbs::Ref<anurbs::Brep>,_std::allocator<anurbs::Ref<anurbs::Brep>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (index = 0;
      index < (ulong)((long)(this->m_entry_map).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_entry_map).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); index = index + 1) {
    get_type_abi_cxx11_((string *)&stack0xffffffffffffff90,this,index);
    Brep::type_name_abi_cxx11_();
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffff90,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    if (!bVar1) {
      get<anurbs::Brep>((Model *)&stack0xffffffffffffff90,(size_t)this);
      std::vector<anurbs::Ref<anurbs::Brep>,std::allocator<anurbs::Ref<anurbs::Brep>>>::
      emplace_back<anurbs::Ref<anurbs::Brep>>
                ((vector<anurbs::Ref<anurbs::Brep>,std::allocator<anurbs::Ref<anurbs::Brep>>> *)
                 __return_storage_ptr__,(Ref<anurbs::Brep> *)&stack0xffffffffffffff90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ref<TData>> of_type() const
    {
        std::vector<Ref<TData>> list;

        for (size_t i = 0; i < nb_entries(); i++) {
            if (get_type(i) != TData::type_name()) {
                continue;
            }
            list.push_back(get<TData>(i));
        }

        return list;
    }